

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QCborKnownTags tag)

{
  int *piVar1;
  long lVar2;
  Stream *pSVar3;
  char *t;
  QDebug *pQVar4;
  int in_EDX;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  pQVar4 = (QDebug *)CONCAT44(in_register_00000034,tag);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,pQVar4);
  t = qt_cbor_tag_id((long)in_EDX);
  pQVar4->stream->space = false;
  if (t == (char *)0x0) {
    pQVar4 = QDebug::operator<<(pQVar4,"QCborKnownTags(");
    pQVar4 = QDebug::operator<<(pQVar4,in_EDX);
    pQVar4 = QDebug::operator<<(pQVar4,')');
  }
  else {
    pQVar4 = QDebug::operator<<(pQVar4,"QCborKnownTags::");
    pQVar4 = QDebug::operator<<(pQVar4,t);
  }
  pSVar3 = pQVar4->stream;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar3;
  piVar1 = &pSVar3->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, QCborKnownTags tag)
{
    QDebugStateSaver saver(dbg);
    const char *id = qt_cbor_tag_id(QCborTag(int(tag)));
    if (id)
        return dbg.nospace() << "QCborKnownTags::" << id;

    return dbg.nospace() << "QCborKnownTags(" << int(tag) << ')';
}